

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Trigger * sqlite3TriggersExist(Parse *pParse,Table *pTab,int op,ExprList *pChanges,int *pMask)

{
  int iVar1;
  Trigger *pTVar2;
  uint uVar3;
  Trigger *pTVar4;
  
  uVar3 = 0;
  if ((pParse->db->flags & 0x20000) == 0) {
    pTVar2 = (Trigger *)0x0;
  }
  else {
    pTVar2 = sqlite3TriggerList(pParse,pTab);
  }
  if (pTVar2 != (Trigger *)0x0) {
    uVar3 = 0;
    pTVar4 = pTVar2;
    do {
      if ((uint)pTVar4->op == op) {
        iVar1 = checkColumnOverlap(pTVar4->pColumns,pChanges);
        if (iVar1 != 0) {
          uVar3 = uVar3 | pTVar4->tr_tm;
        }
      }
      pTVar4 = pTVar4->pNext;
    } while (pTVar4 != (Trigger *)0x0);
  }
  if (pMask != (int *)0x0) {
    *pMask = uVar3;
  }
  if (uVar3 == 0) {
    pTVar2 = (Trigger *)0x0;
  }
  return pTVar2;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggersExist(
  Parse *pParse,          /* Parse context */
  Table *pTab,            /* The table the contains the triggers */
  int op,                 /* one of TK_DELETE, TK_INSERT, TK_UPDATE */
  ExprList *pChanges,     /* Columns that change in an UPDATE statement */
  int *pMask              /* OUT: Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
){
  int mask = 0;
  Trigger *pList = 0;
  Trigger *p;

  if( (pParse->db->flags & SQLITE_EnableTrigger)!=0 ){
    pList = sqlite3TriggerList(pParse, pTab);
  }
  assert( pList==0 || IsVirtual(pTab)==0 );
  for(p=pList; p; p=p->pNext){
    if( p->op==op && checkColumnOverlap(p->pColumns, pChanges) ){
      mask |= p->tr_tm;
    }
  }
  if( pMask ){
    *pMask = mask;
  }
  return (mask ? pList : 0);
}